

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O3

void __thiscall
StaticSynapse::StaticSynapse(StaticSynapse *this,Population *n_from,Population *n_to)

{
  StaticSynapse_param *pSVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00129c90;
  pSVar1 = (StaticSynapse_param *)operator_new(8);
  pSVar1->connection_probability = 0.2;
  this->param = pSVar1;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

StaticSynapse::StaticSynapse(Population* n_from, Population* n_to) : 
    param(new StaticSynapse_param)
{
    initialize(n_from, n_to);
}